

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O1

char_type __thiscall
boost::xpressive::cpp_regex_traits<char>::widen(cpp_regex_traits<char> *this,char ch)

{
  ctype<char> *pcVar1;
  char_type cVar2;
  
  pcVar1 = this->ctype_;
  if (pcVar1[0x38] != (ctype<char>)0x0) {
    return (char_type)pcVar1[(ulong)(byte)ch + 0x39];
  }
  std::ctype<char>::_M_widen_init();
  cVar2 = (**(code **)(*(long *)pcVar1 + 0x30))(pcVar1,(int)ch);
  return cVar2;
}

Assistant:

char_type widen(char ch) const
    {
        return this->ctype_->widen(ch);
    }